

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O0

LO Omega_h::linear_partition_size(GO total,I32 comm_size,I32 comm_rank)

{
  GO rem;
  GO quot;
  GO comm_size_gt;
  I32 comm_rank_local;
  I32 comm_size_local;
  GO total_local;
  
  total_local._4_4_ = (int)(total / (long)comm_size);
  if (comm_rank < (int)(total % (long)comm_size)) {
    total_local._4_4_ = total_local._4_4_ + 1;
  }
  return total_local._4_4_;
}

Assistant:

LO linear_partition_size(GO total, I32 comm_size, I32 comm_rank) {
  auto const comm_size_gt = GO(comm_size);
  auto const quot = total / comm_size_gt;
  auto const rem = total % comm_size_gt;
  if (comm_rank < static_cast<I32>(rem))
    return static_cast<LO>(quot + 1);
  else
    return static_cast<LO>(quot);
}